

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebugManager.cpp
# Opt level: O2

void __thiscall JsrtDebugManager::~JsrtDebugManager(JsrtDebugManager *this)

{
  (this->super_HaltCallback)._vptr_HaltCallback = (_func_int **)&PTR_CanHalt_0136cb68;
  (this->super_DebuggerOptionsCallback)._vptr_DebuggerOptionsCallback =
       (_func_int **)&PTR_IsExceptionReportingEnabled_0136cbd8;
  (this->super_HostDebugContext)._vptr_HostDebugContext = (_func_int **)&PTR_Delete_0136cc08;
  if (this->debuggerObjectsManager != (JsrtDebuggerObjectsManager *)0x0) {
    Memory::
    DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,JsrtDebuggerObjectsManager>
              (this->debugObjectArena,this->debuggerObjectsManager);
    this->debuggerObjectsManager = (JsrtDebuggerObjectsManager *)0x0;
  }
  if (this->debugDocumentManager != (JsrtDebugDocumentManager *)0x0) {
    Memory::
    DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,JsrtDebugDocumentManager>
              (this->debugObjectArena,this->debugDocumentManager);
    this->debugDocumentManager = (JsrtDebugDocumentManager *)0x0;
  }
  if (this->debugObjectArena != (ArenaAllocator *)0x0) {
    Memory::Recycler::UnregisterExternalGuestArena
              (this->threadContext->recycler,
               &(this->debugObjectArena->
                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>).
                super_ArenaData);
    Memory::
    DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,Memory::ArenaAllocator>
              (&Memory::HeapAllocator::Instance,this->debugObjectArena);
    this->debugObjectArena = (ArenaAllocator *)0x0;
  }
  this->threadContext = (ThreadContext *)0x0;
  this->debugEventCallback = (JsDiagDebugEventCallback)0x0;
  this->callbackState = (void *)0x0;
  return;
}

Assistant:

JsrtDebugManager::~JsrtDebugManager()
{
    if (this->debuggerObjectsManager != nullptr)
    {
        Adelete(this->debugObjectArena, this->debuggerObjectsManager);
        this->debuggerObjectsManager = nullptr;
    }

    if (this->debugDocumentManager != nullptr)
    {
        Adelete(this->debugObjectArena, this->debugDocumentManager);
        this->debugDocumentManager = nullptr;
    }

    if (this->debugObjectArena != nullptr)
    {
        this->threadContext->GetRecycler()->UnregisterExternalGuestArena(this->debugObjectArena);
        HeapDelete(this->debugObjectArena);
        this->debugObjectArena = nullptr;
    }

    this->debugEventCallback = nullptr;
    this->callbackState = nullptr;
    this->threadContext = nullptr;
}